

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsEndpointSendStringTo(HelicsEndpoint endpoint,char *message,char *dest,HelicsError *err)

{
  Endpoint *this;
  size_t data_size;
  size_t sVar1;
  _Alloc_hider _Var2;
  _Alloc_hider data;
  string_view dest_00;
  
  if (err == (HelicsError *)0x0) {
    if (endpoint == (HelicsEndpoint)0x0) {
      return;
    }
    if (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((endpoint == (HelicsEndpoint)0x0) || (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      err->message = "The given endpoint does not point to a valid object";
      return;
    }
  }
  this = *endpoint;
  data_size = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  data._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
  if (message != (char *)0x0) {
    data_size = strlen(message);
    data._M_p = message;
  }
  sVar1 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  _Var2._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
  if (dest != (char *)0x0) {
    sVar1 = strlen(dest);
    _Var2._M_p = dest;
  }
  dest_00._M_str = _Var2._M_p;
  dest_00._M_len = sVar1;
  helics::Endpoint::sendTo(this,data._M_p,data_size,dest_00);
  return;
}

Assistant:

void helicsEndpointSendStringTo(HelicsEndpoint endpoint, const char* message, const char* dest, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->sendTo(AS_STRING_VIEW(message), AS_STRING_VIEW(dest));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}